

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

CornerIndex __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::GetLeftCorner
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          CornerIndex corner_id)

{
  if (corner_id.value_ != 0xffffffff) {
    corner_id.value_ = corner_id.value_ + ((corner_id.value_ * -0x55555555 < 0x55555556) - 1 | 2);
  }
  if (corner_id.value_ != 0xffffffff) {
    corner_id.value_ =
         *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                               super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                               .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl)->
                             opposite_corners_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  + (ulong)corner_id.value_ * 4);
  }
  return (CornerIndex)corner_id.value_;
}

Assistant:

CornerIndex MeshEdgebreakerEncoderImpl<TraversalEncoder>::GetLeftCorner(
    CornerIndex corner_id) const {
  const CornerIndex prev_corner_id = corner_table_->Previous(corner_id);
  return corner_table_->Opposite(prev_corner_id);
}